

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_stats(void)

{
  roaring_statistics_t stats;
  uint32_t i_1;
  uint32_t i;
  roaring_bitmap_t *r1;
  undefined8 in_stack_ffffffffffffffa8;
  int line;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  roaring_bitmap_t *in_stack_ffffffffffffffc0;
  roaring_statistics_t *in_stack_ffffffffffffffc8;
  roaring_bitmap_t *in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar1;
  uint uVar2;
  
  line = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  roaring_bitmap_create();
  _assert_true((unsigned_long)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0,line);
  for (uVar2 = 100; uVar2 < 1000; uVar2 = uVar2 + 1) {
    roaring_bitmap_add((roaring_bitmap_t *)CONCAT44(uVar2,in_stack_fffffffffffffff0),
                       in_stack_ffffffffffffffec);
  }
  for (uVar1 = 1000; uVar1 < 100000; uVar1 = uVar1 + 10) {
    roaring_bitmap_add((roaring_bitmap_t *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffec);
  }
  roaring_bitmap_add((roaring_bitmap_t *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffec);
  roaring_bitmap_statistics(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  roaring_bitmap_get_cardinality(in_stack_ffffffffffffffc0);
  _assert_true((unsigned_long)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffec);
  _assert_true((unsigned_long)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffec);
  _assert_true((unsigned_long)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffec);
  roaring_bitmap_free((roaring_bitmap_t *)0x10e5e0);
  return;
}

Assistant:

DEFINE_TEST(test_stats) {
    // create a new empty bitmap
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    assert_non_null(r1);
    // then we can add values
    for (uint32_t i = 100; i < 1000; i++) {
        roaring_bitmap_add(r1, i);
    }
    for (uint32_t i = 1000; i < 100000; i += 10) {
        roaring_bitmap_add(r1, i);
    }
    roaring_bitmap_add(r1, 100000);

    roaring_statistics_t stats;
    roaring_bitmap_statistics(r1, &stats);
    assert_true(stats.cardinality == roaring_bitmap_get_cardinality(r1));
    assert_true(stats.min_value == 100);
    assert_true(stats.max_value == 100000);
    roaring_bitmap_free(r1);
}